

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O2

void __thiscall xray_re::xr_spawn_object::save_v12(xr_spawn_object *this,xr_ini_writer *w)

{
  int iVar1;
  xr_ini_packet *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  allocator_type local_59;
  xr_custom_object_vec objects;
  string local_40 [32];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    xr_ini_writer::write(w,0x1d2bb8,(void *)0x1,in_RCX);
  }
  xr_ini_writer::write
            (w,0x1d296f,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,in_RCX);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x17,in_RCX);
  iVar1 = *(int *)&(this->super_xr_custom_object).field_0x6c;
  if (iVar1 == 0) {
    xr_ini_writer::write(w,0x1d1543,(void *)(ulong)(this->field_1).field_0.m_game,in_RCX);
    __n = 0;
    xr_ini_writer::write(w,0x1d2c1b,"",0);
    xr_ini_writer::write(w,0x1d2c26,(void *)(ulong)(this->field_1).field_0.m_respawn,__n);
    xr_ini_writer::write(w,0x1d2c2e,(void *)(ulong)(this->field_1).field_0.m_team,__n);
  }
  else if (iVar1 == 1) {
    xr_ini_writer::write(w,0x1d2c36,(void *)(ulong)(this->field_1).field_1.m_ambient_color,in_RCX);
    xr_ini_writer::write(w,0x1d2c44,(void *)0xffff,in_RCX);
    xr_ini_writer::write(w,0x1d2c4d,__buf,in_RCX);
    xr_ini_writer::write(w,0x1d2c56,__buf_00,in_RCX);
    xr_ini_writer::write(w,0x1d2c60,(void *)(ulong)(this->field_1).field_1.m_fog_color,in_RCX);
    xr_ini_writer::write(w,0x1d2c6a,__buf_01,in_RCX);
    xr_ini_writer::write(w,0x1d2c76,(void *)(ulong)(this->field_1).field_1.m_hemi_color,in_RCX);
    xr_ini_writer::write(w,0x1d2c81,(void *)(ulong)(this->field_1).field_1.m_sky_color,in_RCX);
    xr_ini_writer::write(w,0x1d2c8b,__buf_02,in_RCX);
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xc6,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    if ((this->field_1).m_entity == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xa1,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    xr_ini_writer::open_section(w,"spawndata");
    this_00 = (xr_ini_packet *)operator_new(0x11a8);
    xr_ini_packet::xr_ini_packet(this_00);
    cse_abstract::spawn_write((this->field_1).m_entity,(xr_packet *)this_00,true);
    xr_ini_writer::write_packet(w,this_00);
    xr_ini_writer::write(w,0x1d2c18,(void *)0x0,in_RCX);
    std::__cxx11::string::string(local_40,(string *)&((this->field_1).m_entity)->m_s_name);
    xr_ini_writer::write(w,0x1d03c6,local_40,0);
    std::__cxx11::string::~string(local_40);
    xr_ini_writer::close_section(w);
    operator_delete(this_00,0x1018);
  }
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::vector
              (&objects,1,&this->m_attached_object,&local_59);
    xr_scene::save_objects((this->super_xr_custom_object).m_scene,w,&objects,"attached");
    std::_Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
    ~_Vector_base(&objects.
                   super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                 );
  }
  return;
}

Assistant:

void xr_spawn_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	if (this->m_attached_object)
		w->write("attached_count", 1);

	w->write("type", this->m_type);
	w->write("version", SPAWNPOINT_VERSION_V12);

	if (m_type == SPAWNPOINT_TYPE_ENTITY) {
		xr_assert(m_entity);

		w->open_section("spawndata");
		
		xr_ini_packet *ini_packet = new xr_ini_packet();
		xr_packet* packet = ini_packet;
		m_entity->spawn_write(*packet, true);
		//w->w_packet(*ini_packet);
		w->write_packet(ini_packet);

		w->write("fl", 0);
		w->write("name", this->m_entity->name(), false);
		w->close_section();

		delete packet;
	}
	else if (m_type == SPAWNPOINT_TYPE_RPOINT)
	{
		w->write("game_type", m_game);
		w->write("rp_profile", "", false);
		w->write("rp_type", m_respawn);
		w->write("team_id", m_team);
	} 
	else if (m_type == SPAWNPOINT_TYPE_ENV_MOD)
	{
		w->write("ambient_color", m_ambient_color);
		w->write("em_flags", 65535); // apparently em_flags don't exist in current code
		w->write("em_power", m_power);
		w->write("em_radius", m_radius);
		w->write("fog_color", m_fog_color);
		w->write("fog_density", m_fog_density);
		w->write("hemi_color", m_hemi_color);
		w->write("sky_color", m_sky_color);
		w->write("view_dist", m_view_distance);
	}
	else
	{
		xr_not_expected();
	}
	
	if (this->m_attached_object)
	{
		xr_custom_object_vec objects(1, m_attached_object);
		scene().save_objects(w, objects, "attached");
	}
}